

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

string * duckdb::StringUtil::URLEncode
                   (string *__return_storage_ptr__,string *input,bool encode_slash)

{
  RESULT_TYPE __n;
  RESULT_TYPE __s;
  idx_t result_length;
  RESULT_TYPE local_38;
  
  local_38 = (RESULT_TYPE)0x0;
  URLEncodeInternal<duckdb::URLEncodeLength>
            ((input->_M_dataplus)._M_p,input->_M_string_length,(RESULT_TYPE *)&local_38,encode_slash
            );
  __n = local_38;
  __s = (RESULT_TYPE)operator_new__((ulong)local_38);
  switchD_01306cb1::default(__s,0,(size_t)__n);
  local_38 = __s;
  URLEncodeInternal<duckdb::URLEncodeWrite>
            ((input->_M_dataplus)._M_p,input->_M_string_length,&local_38,encode_slash);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,__s,__s + (long)__n);
  operator_delete__(__s);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::URLEncode(const string &input, bool encode_slash) {
	idx_t result_size = URLEncodeSize(input.c_str(), input.size(), encode_slash);
	auto result_data = make_uniq_array<char>(result_size);
	URLEncodeBuffer(input.c_str(), input.size(), result_data.get(), encode_slash);
	return string(result_data.get(), result_size);
}